

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::FetchNumber(internalJSONNode *this)

{
  char *__nptr;
  double dVar1;
  internalJSONNode *this_local;
  
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(__nptr);
  (this->_value)._number = dVar1;
  return;
}

Assistant:

void internalJSONNode::FetchNumber(void) const json_nothrow {
    #ifdef JSON_STRICT
		_value._number = NumberToString::_atof(_string.c_str());
    #else 
	   #ifdef JSON_UNICODE
		  const size_t len = _string.length();
		  #if defined(_MSC_VER) && defined(JSON_SAFE) 
			 const size_t bytes = (len * (sizeof(json_char) / sizeof(char))) + 1;
			 json_auto<char> temp(bytes);
			 size_t res;
			 errno_t err = wcstombs_s(&res, temp.ptr, bytes, _string.c_str(), len);
			 if (err != 0){
				_value._number = (json_number)0.0;
				return;
			 }
		  #elif defined(JSON_SAFE)
			 const size_t bytes = (len * (sizeof(json_char) / sizeof(char))) + 1;
			 json_auto<char> temp(bytes);
			 size_t res = std::wcstombs(temp.ptr, _string.c_str(), len);
			 if (res == (size_t)-1){
				_value._number = (json_number)0.0;
				return;
			 }
		  #else 
			 json_auto<char> temp(len + 1);
			 size_t res = std::wcstombs(temp.ptr, _string.c_str(), len);
		  #endif 
		  temp.ptr[res] = '\0';
		  _value._number = (json_number)std::atof(temp.ptr);
	   #else
		  _value._number = (json_number)std::atof(_string.c_str());
	   #endif
    #endif
    #if((!defined(JSON_CASTABLE) && defined(JSON_LESS_MEMORY)) && !defined(JSON_WRITE_PRIORITY))
	   clearString(_string);
    #endif
}